

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O1

Cluster * __thiscall amrex::Cluster::new_chop(Cluster *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  void *pvVar4;
  bool bVar5;
  int minlen;
  int iVar6;
  int iVar7;
  long lVar8;
  IntVect *pIVar9;
  Cluster *this_00;
  int n;
  int *piVar10;
  ulong uVar11;
  IntVect *pIVar12;
  IntVect *pIVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  Cluster *pCVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  CutStatus CVar21;
  IntVect *pIVar22;
  IntVect cut;
  CutStatus status [3];
  Array<Vector<int>,_3> hist;
  uint local_124;
  Cluster *local_120;
  ulong local_118;
  uint local_110;
  double local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  long local_e8;
  ulong local_e0;
  undefined8 local_d8;
  int local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b0;
  CutStatus CStack_a4;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> vStack_80;
  vector<int,_std::allocator<int>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar6 = (this->m_bx).smallend.vect[1];
  iVar14 = (this->m_bx).bigend.vect[1];
  iVar18 = (this->m_bx).bigend.vect[2];
  iVar3 = (this->m_bx).smallend.vect[2];
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_98,(long)(((this->m_bx).bigend.vect[0] - (this->m_bx).smallend.vect[0]) + 1),
             (value_type_conflict *)&local_f8);
  local_f8 = local_f8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&vStack_80,(long)((iVar14 - iVar6) + 1),(value_type_conflict *)&local_f8);
  local_f8 = local_f8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_68,(long)((iVar18 - iVar3) + 1),(value_type_conflict *)&local_f8);
  lVar8 = this->m_len;
  if (0 < lVar8) {
    piVar10 = this->m_ar->vect + 2;
    do {
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)((IntVect *)(piVar10 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]] =
           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)((IntVect *)(piVar10 + -2))->vect[0] - (long)(this->m_bx).smallend.vect[0]
                   ] + 1;
      vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)piVar10[-1] - (long)(this->m_bx).smallend.vect[1]] =
           vStack_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)piVar10[-1] - (long)(this->m_bx).smallend.vect[1]] + 1;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)*piVar10 - (long)(this->m_bx).smallend.vect[2]] =
           local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[(long)*piVar10 - (long)(this->m_bx).smallend.vect[2]] + 1;
      piVar10 = piVar10 + 3;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  local_e0 = 0;
  local_124 = 0xffffffff;
  local_100 = 0;
  do {
    local_118 = 0;
    local_110 = 0;
    CVar21 = InvalidCut;
    pvVar20 = &local_98;
    lVar8 = 0;
    do {
      if ((ulong)local_124 << 2 != lVar8) {
        iVar6 = FindCut((pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start,
                        *(int *)((long)(this->m_bx).smallend.vect + lVar8),
                        *(int *)((long)(this->m_bx).bigend.vect + lVar8),
                        (CutStatus *)((long)&CStack_a4 + lVar8));
        *(int *)((long)&local_118 + lVar8) = iVar6;
        if ((int)*(CutStatus *)((long)&CStack_a4 + lVar8) < (int)CVar21) {
          CVar21 = *(CutStatus *)((long)&CStack_a4 + lVar8);
        }
      }
      lVar8 = lVar8 + 4;
      pvVar20 = pvVar20 + 1;
    } while (lVar8 != 0xc);
    iVar6 = -1;
    uVar11 = 0;
    uVar17 = 0xffffffff;
    do {
      if ((&CStack_a4)[uVar11] == CVar21) {
        iVar14 = *(int *)((long)&local_118 + uVar11 * 4);
        iVar18 = (this->m_bx).bigend.vect[uVar11] - iVar14;
        iVar14 = iVar14 - (this->m_bx).smallend.vect[uVar11];
        if (iVar14 <= iVar18) {
          iVar18 = iVar14;
        }
        if (iVar6 <= iVar18) {
          uVar17 = uVar11 & 0xffffffff;
        }
        if (iVar6 < iVar18) {
          iVar6 = iVar18;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 3);
    uVar16 = (uint)uVar17;
    lVar8 = (long)(int)uVar16;
    iVar6 = (this->m_bx).smallend.vect[lVar8];
    iVar14 = *(int *)((long)&local_118 + lVar8 * 4);
    uVar11 = 0;
    if (iVar6 < iVar14) {
      lVar15 = 0;
      uVar11 = 0;
      do {
        uVar11 = (ulong)(uint)((int)uVar11 +
                              (&local_98)[lVar8].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar15]);
        lVar15 = lVar15 + 1;
      } while ((long)iVar14 - (long)iVar6 != lVar15);
    }
    if (((int)uVar11 < 1) || (lVar8 = this->m_len, lVar8 <= (long)uVar11)) {
      local_120 = chop(this);
      bVar5 = false;
    }
    else {
      local_b0 = uVar11;
      pIVar12 = this->m_ar;
      local_f8 = local_118;
      local_f0 = uVar17 << 0x20 | (ulong)local_110;
      if (lVar8 != 0) {
        pIVar9 = pIVar12 + lVar8;
        do {
          lVar15 = (long)(int)uVar16;
          iVar6 = *(int *)((long)&local_f8 + lVar15 * 4);
          pIVar22 = pIVar12;
          while (pIVar22->vect[lVar15] < iVar6) {
            pIVar12 = pIVar22 + 1;
            pIVar22 = pIVar12;
            if (pIVar12 == pIVar9) goto LAB_00676b70;
          }
          do {
            pIVar13 = pIVar9;
            pIVar9 = pIVar13 + -1;
            pIVar12 = pIVar22;
            if (pIVar9 == pIVar22) goto LAB_00676b70;
          } while (iVar6 <= pIVar13[-1].vect[lVar15]);
          local_d0 = pIVar22->vect[2];
          local_d8 = *(undefined8 *)pIVar22->vect;
          pIVar22->vect[2] = pIVar13[-1].vect[2];
          *(undefined8 *)pIVar22->vect = *(undefined8 *)pIVar9->vect;
          pIVar13[-1].vect[2] = local_d0;
          *(undefined8 *)pIVar9->vect = local_d8;
          pIVar12 = pIVar22 + 1;
        } while (pIVar9 != pIVar12);
        pIVar12 = pIVar22 + 1;
      }
LAB_00676b70:
      iVar6 = (this->m_bx).bigend.vect[0];
      iVar14 = (this->m_bx).smallend.vect[0];
      local_c8 = CONCAT44(local_c8._4_4_,(this->m_bx).bigend.vect[1] - (this->m_bx).smallend.vect[1]
                         );
      local_e8 = this->m_len;
      iVar18 = (this->m_bx).bigend.vect[2];
      iVar3 = (this->m_bx).smallend.vect[2];
      local_108 = (double)lVar8;
      this_00 = (Cluster *)operator_new(0x30);
      iVar7 = SUB84(local_108,0);
      local_108 = (double)local_e8 /
                  ((double)((iVar18 - iVar3) + 1) *
                  (double)((int)local_c8 + 1) * (double)((iVar6 - iVar14) + 1));
      (this_00->m_bx).smallend.vect[0] = 1;
      (this_00->m_bx).smallend.vect[1] = 1;
      (this_00->m_bx).smallend.vect[2] = 1;
      (this_00->m_bx).bigend.vect[0] = 0;
      (this_00->m_bx).bigend.vect[1] = 0;
      *(undefined8 *)((this_00->m_bx).bigend.vect + 2) = 0;
      this_00->m_ar = pIVar12;
      this_00->m_len = (long)(iVar7 - (int)uVar11);
      minBox(this_00);
      lVar8 = this_00->m_len;
      local_c8 = *(undefined8 *)(this_00->m_bx).bigend.vect;
      uStack_c0 = 0;
      local_48 = *(undefined8 *)(this_00->m_bx).smallend.vect;
      uStack_40 = 0;
      iVar6 = (this_00->m_bx).smallend.vect[2];
      iVar14 = (this_00->m_bx).bigend.vect[2];
      this->m_len = local_b0;
      minBox(this);
      uVar1 = *(undefined8 *)(this->m_bx).bigend.vect;
      uVar2 = *(undefined8 *)(this->m_bx).smallend.vect;
      if ((double)this->m_len /
          ((double)(((this->m_bx).bigend.vect[2] - (this->m_bx).smallend.vect[2]) + 1) *
          (double)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1) *
          (double)(((int)uVar1 - (int)uVar2) + 1)) <= local_108) {
        bVar5 = false;
        pCVar19 = (Cluster *)0x0;
        if ((int)local_100 == 0) {
          if ((double)lVar8 /
              ((double)((iVar14 - iVar6) + 1) *
              (double)((local_c8._4_4_ - local_48._4_4_) + 1) *
              (double)(((int)local_c8 - (int)local_48) + 1)) <= local_108) {
            this->m_len = (long)(int)local_e8;
            minBox(this);
            bVar5 = true;
            pCVar19 = this_00;
            this_00 = local_120;
            local_124 = uVar16;
          }
        }
      }
      else {
        bVar5 = false;
        pCVar19 = (Cluster *)0x0;
      }
      local_120 = this_00;
      if (pCVar19 != (Cluster *)0x0) {
        operator_delete(pCVar19,0x30);
      }
    }
    if (!bVar5) break;
    iVar6 = (int)local_100;
    local_e0 = CONCAT71((int7)(local_100 >> 8),iVar6 != 0);
    local_100 = (ulong)(iVar6 + 1);
  } while (iVar6 == 0);
  if ((local_e0 & 1) != 0) {
    Abort_host("Should never reach this point in Cluster::new_chop()");
    local_120 = this;
  }
  lVar8 = 0x48;
  do {
    pvVar4 = *(void **)((long)&local_b0 + lVar8);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,*(long *)((long)&local_a0 + lVar8) - (long)pvVar4);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  return local_120;
}

Assistant:

Cluster*
Cluster::new_chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                      hist[1][p[1]-lo[1]]++;,
                      hist[2][p[2]-lo[2]]++; )
    }

    int invalid_dir = -1;
    for (int n_try = 0; n_try < 2; n_try++)
    {
       //
       // Find cutpoint and cutstatus in each index direction.
       //
       CutStatus mincut = InvalidCut;
       CutStatus status[AMREX_SPACEDIM];
       IntVect cut;
       for (int n = 0; n < AMREX_SPACEDIM; n++)
       {
           if (n != invalid_dir)
           {
              cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
              if (status[n] < mincut)
              {
                  mincut = status[n];
              }
           }
       }
       BL_ASSERT(mincut != InvalidCut);
       //
       // Select best cutpoint and direction.
       //
       int dir = -1;
       for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
       {
           if (status[n] == mincut)
           {
               int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
               if (mincutlen >= minlen)
               {
                   dir = n;
                   minlen = mincutlen;
               }
           }
       }
       BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

       int nlo = 0;
       for (int i = lo[dir]; i < cut[dir]; i++) {
           nlo += hist[dir][i-lo[dir]];
       }

       if (nlo <= 0 || nlo >= m_len) return chop();

       int nhi = m_len - nlo;

       IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

       BL_ASSERT((prt_it-m_ar) == nlo);
       BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

       // These refer to the box that was originally passed in
       Real oldeff = eff();
       int orig_mlen = m_len;

       // Define the new box "above" the cut
       std::unique_ptr<Cluster> newbox(new Cluster(prt_it, nhi));
       Real neweff = newbox->eff();

       // Replace the current box by the part of the box "below" the cut
       m_len = nlo;
       minBox();

       if ( (eff() > oldeff) || (neweff > oldeff) || n_try > 0)
       {
          return newbox.release();

       } else {

          // Restore the original box and try again, cutting in a different direction
          m_len = orig_mlen;
          minBox();
          invalid_dir = dir;
       }
   }

    amrex::Abort("Should never reach this point in Cluster::new_chop()");
    return this;
}